

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.h
# Opt level: O2

string * __thiscall
ICM::TypeBase::FunctionType::to_string_abi_cxx11_(string *__return_storage_ptr__,FunctionType *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"F(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (GlobalFunctionTable._8_8_ + this->index * 0x78 + 8));
  std::operator+(__return_storage_ptr__,&local_30,")");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string to_string() const {
				return "F(" + getData().getName() + ")";
			}